

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O1

Vector3<double> * __thiscall
OpenMD::SquareMatrix3<double>::toEulerAngles
          (Vector3<double> *__return_storage_ptr__,SquareMatrix3<double> *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  dVar6 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  uVar4 = SUB84(dVar6,0);
  uVar5 = (undefined4)((ulong)dVar6 >> 0x20);
  if (dVar6 <= -1.0) {
    uVar4 = 0;
    uVar5 = 0xbff00000;
  }
  if (1.0 <= (double)CONCAT44(uVar5,uVar4)) {
    uVar4 = 0;
    uVar5 = 0x3ff00000;
  }
  dVar1 = acos((double)CONCAT44(uVar5,uVar4));
  dVar6 = (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar6 = 1.0 - dVar6 * dVar6;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if (1e-06 <= ABS(dVar6)) {
    dVar6 = atan2((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0]
                  ,-(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2]
                    [1]);
    dVar2 = atan2((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2]
                  ,(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [2]);
    uVar4 = SUB84(dVar2,0);
    uVar5 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    dVar6 = atan2(-(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0],(this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                       [0][0]);
    uVar4 = 0;
    uVar5 = 0;
  }
  uVar3 = -(ulong)((double)CONCAT44(uVar5,uVar4) < 0.0);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] =
       (double)(~-(ulong)(dVar6 < 0.0) & (ulong)dVar6 |
               (ulong)(dVar6 + 6.283185307179586) & -(ulong)(dVar6 < 0.0));
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = dVar1;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] =
       (double)(~uVar3 & CONCAT44(uVar5,uVar4) |
               (ulong)((double)CONCAT44(uVar5,uVar4) + 6.283185307179586) & uVar3);
  return __return_storage_ptr__;
}

Assistant:

Vector3<Real> toEulerAngles() {
      Vector3<Real> myEuler;
      Real phi;
      Real theta;
      Real psi;
      Real ctheta;
      Real stheta;

      // set the tolerance for Euler angles and rotation elements

      theta = acos(
          std::min((RealType)1.0, std::max((RealType)-1.0, this->data_[2][2])));
      ctheta = this->data_[2][2];
      stheta = sqrt(1.0 - ctheta * ctheta);

      // when sin(theta) is close to 0, we need to consider
      // singularity In this case, we can assign an arbitary value to
      // phi (or psi), and then determine the psi (or phi) or
      // vice-versa. We'll assume that phi always gets the rotation,
      // and psi is 0 in cases of singularity.
      // we use atan2 instead of atan, since atan2 will give us -Pi to Pi.
      // Since 0 <= theta <= 180, sin(theta) will be always
      // non-negative. Therefore, it will never change the sign of both of
      // the parameters passed to atan2.

      if (fabs(stheta) < 1e-6) {
        psi = 0.0;
        phi = atan2(-this->data_[1][0], this->data_[0][0]);
      }
      // we only have one unique solution
      else {
        phi = atan2(this->data_[2][0], -this->data_[2][1]);
        psi = atan2(this->data_[0][2], this->data_[1][2]);
      }

      // wrap phi and psi, make sure they are in the range from 0 to 2*Pi
      if (phi < 0) phi += 2.0 * Constants::PI;

      if (psi < 0) psi += 2.0 * Constants::PI;

      myEuler[0] = phi;
      myEuler[1] = theta;
      myEuler[2] = psi;

      return myEuler;
    }